

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O3

unsigned_long xmlDictComputeFastKey(xmlChar *name,int namelen,int seed)

{
  unsigned_long uVar1;
  
  if (name == (xmlChar *)0x0) {
    return 0;
  }
  uVar1 = ((ulong)*name + (long)seed) * 0x20;
  if (10 < namelen) {
    uVar1 = uVar1 + name[(ulong)(uint)namelen - 1];
switchD_00141c6f_caseD_a:
    uVar1 = uVar1 + name[9];
    goto switchD_00141c6f_caseD_9;
  }
  switch(namelen) {
  case 9:
switchD_00141c6f_caseD_9:
    uVar1 = uVar1 + name[8];
  case 8:
    uVar1 = uVar1 + name[7];
  case 7:
    uVar1 = uVar1 + name[6];
  case 6:
    uVar1 = uVar1 + name[5];
  case 5:
    uVar1 = uVar1 + name[4];
  case 4:
    uVar1 = uVar1 + name[3];
  case 3:
    uVar1 = uVar1 + name[2];
  case 2:
    return uVar1 + name[1];
  case 10:
    goto switchD_00141c6f_caseD_a;
  default:
    return uVar1;
  }
}

Assistant:

static unsigned long
xmlDictComputeFastKey(const xmlChar *name, int namelen, int seed) {
    unsigned long value = seed;

    if (name == NULL) return(0);
    value += *name;
    value <<= 5;
    if (namelen > 10) {
        value += name[namelen - 1];
        namelen = 10;
    }
    switch (namelen) {
        case 10: value += name[9];
        /* Falls through. */
        case 9: value += name[8];
        /* Falls through. */
        case 8: value += name[7];
        /* Falls through. */
        case 7: value += name[6];
        /* Falls through. */
        case 6: value += name[5];
        /* Falls through. */
        case 5: value += name[4];
        /* Falls through. */
        case 4: value += name[3];
        /* Falls through. */
        case 3: value += name[2];
        /* Falls through. */
        case 2: value += name[1];
        /* Falls through. */
        default: break;
    }
    return(value);
}